

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compilers.cc
# Opt level: O0

instruction_t __thiscall
tchecker::details::
rvalue_expression_compiler_t<std::back_insert_iterator<std::vector<long,_std::allocator<long>_>_>_>
::operator_to_instruction
          (rvalue_expression_compiler_t<std::back_insert_iterator<std::vector<long,_std::allocator<long>_>_>_>
           *this,binary_operator_t op)

{
  runtime_error *this_00;
  binary_operator_t op_local;
  rvalue_expression_compiler_t<std::back_insert_iterator<std::vector<long,_std::allocator<long>_>_>_>
  *this_local;
  
  switch(op) {
  case EXPR_OP_LAND:
    this_local._4_4_ = VM_LAND;
    break;
  case EXPR_OP_LT:
    this_local._4_4_ = VM_LT;
    break;
  case EXPR_OP_LE:
    this_local._4_4_ = VM_LE;
    break;
  case EXPR_OP_EQ:
    this_local._4_4_ = VM_EQ;
    break;
  case EXPR_OP_NEQ:
    this_local._4_4_ = VM_NE;
    break;
  case EXPR_OP_GE:
    this_local._4_4_ = VM_GE;
    break;
  case EXPR_OP_GT:
    this_local._4_4_ = VM_GT;
    break;
  case EXPR_OP_MINUS:
    this_local._4_4_ = VM_MINUS;
    break;
  case EXPR_OP_PLUS:
    this_local._4_4_ = VM_SUM;
    break;
  case EXPR_OP_TIMES:
    this_local._4_4_ = VM_MUL;
    break;
  case EXPR_OP_DIV:
    this_local._4_4_ = VM_DIV;
    break;
  case EXPR_OP_MOD:
    this_local._4_4_ = VM_MOD;
    break;
  default:
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"incomplete switch statement");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  return this_local._4_4_;
}

Assistant:

enum tchecker::instruction_t operator_to_instruction(enum tchecker::binary_operator_t op)
  {
    switch (op) {
    case tchecker::EXPR_OP_LAND:
      return tchecker::VM_LAND;
    case tchecker::EXPR_OP_LT:
      return tchecker::VM_LT;
    case tchecker::EXPR_OP_LE:
      return tchecker::VM_LE;
    case tchecker::EXPR_OP_EQ:
      return tchecker::VM_EQ;
    case tchecker::EXPR_OP_NEQ:
      return tchecker::VM_NE;
    case tchecker::EXPR_OP_GE:
      return tchecker::VM_GE;
    case tchecker::EXPR_OP_GT:
      return tchecker::VM_GT;
    case tchecker::EXPR_OP_MINUS:
      return tchecker::VM_MINUS;
    case tchecker::EXPR_OP_PLUS:
      return tchecker::VM_SUM;
    case tchecker::EXPR_OP_TIMES:
      return tchecker::VM_MUL;
    case tchecker::EXPR_OP_DIV:
      return tchecker::VM_DIV;
    case tchecker::EXPR_OP_MOD:
      return tchecker::VM_MOD;
    default:
      throw std::runtime_error("incomplete switch statement");
    }
  }